

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall unitStrings_singleBase_Test::TestBody(unitStrings_singleBase_Test *this)

{
  bool bVar1;
  precise_unit *ppVar2;
  char *pcVar3;
  uint64_t in_RCX;
  string *__return_storage_ptr__;
  double in_XMM1_Qa;
  AssertHelper local_f0;
  Message local_e8;
  precise_unit local_e0;
  precise_unit local_d0;
  precise_unit local_c0;
  string local_b0;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_78 [3];
  precise_unit local_60;
  precise_unit local_50;
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  unitStrings_singleBase_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_60 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::kilo,(precise_unit *)units::precise::J);
  local_50 = units::precise_unit::operator/(&local_60,(precise_unit *)units::precise::mol);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  __return_storage_ptr__ = &local_40;
  units::to_string_abi_cxx11_(__return_storage_ptr__,(units *)&local_50,ppVar2,in_RCX);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_nullptr>
            ((EqHelper *)local_20,"to_string(precise::kilo * precise::J / precise::mol)",
             "\"kJ/mol\"",__return_storage_ptr__,(char (*) [7])"kJ/mol");
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    __return_storage_ptr__ = (string *)0x1a8;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1a8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_d0 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::kilo,(precise_unit *)units::precise::J);
  local_e0.multiplier_ =
       units::precise_unit::pow((precise_unit *)units::precise::rad,local_d0.multiplier_,in_XMM1_Qa)
  ;
  local_c0 = units::precise_unit::operator/(&local_d0,&local_e0);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_b0,(units *)&local_c0,ppVar2,(uint64_t)__return_storage_ptr__);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_90,"to_string(precise::kilo * precise::J / precise::rad.pow(2))",
             "\"kJ/rad^2\"",&local_b0,(char (*) [9])"kJ/rad^2");
  std::__cxx11::string::~string((string *)&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1ab,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  return;
}

Assistant:

TEST(unitStrings, singleBase)
{
    EXPECT_EQ(to_string(precise::kilo * precise::J / precise::mol), "kJ/mol");
    EXPECT_EQ(
        to_string(precise::kilo * precise::J / precise::rad.pow(2)),
        "kJ/rad^2");
}